

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMapTestCase.cpp
# Opt level: O0

void __thiscall
SuiteFieldMapTests::TesthasGroup_groupExists::RunImpl(TesthasGroup_groupExists *this)

{
  TestResults *results;
  byte bVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_168;
  bool local_142;
  bool local_141;
  message_order local_140;
  FieldMap local_120 [8];
  FieldMap group;
  message_order local_a0;
  FieldMap local_80 [8];
  FieldMap fieldMap;
  TesthasGroup_groupExists *this_local;
  
  FIX::message_order::message_order(&local_a0,normal);
  FIX::FieldMap::FieldMap(local_80,&local_a0);
  FIX::message_order::~message_order(&local_a0);
  FIX::message_order::message_order(&local_140,normal);
  FIX::FieldMap::FieldMap(local_120,&local_140);
  FIX::message_order::~message_order(&local_140);
  FIX::FieldMap::addGroup((int)local_80,(FieldMap *)0x1,SUB81(local_120,0));
  ppTVar2 = UnitTest::CurrentTest::Results();
  results = *ppTVar2;
  local_141 = true;
  bVar1 = FIX::FieldMap::hasGroup((int)local_80);
  local_142 = (bool)(bVar1 & 1);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_168,*ppTVar3,0x5d);
  UnitTest::CheckEqual<bool,bool>(results,&local_141,&local_142,&local_168);
  FIX::FieldMap::~FieldMap(local_120);
  FIX::FieldMap::~FieldMap(local_80);
  return;
}

Assistant:

TEST(hasGroup_groupExists)
{
  FieldMap fieldMap;
  FieldMap group;
  fieldMap.addGroup(1, group);

  CHECK_EQUAL(true, fieldMap.hasGroup(1));
}